

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
gl3cts::TransformFeedbackOverflowQueryErrorInvalidIndex::iterate
          (TransformFeedbackOverflowQueryErrorInvalidIndex *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  GLuint i;
  uint uVar4;
  uint uVar5;
  GLint value;
  long lVar3;
  
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryErrorBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (this->super_TransformFeedbackOverflowQueryErrorBase).m_case_name =
       "GetQueryIndexediv must generate INVALID_VALUE if <target> is TRANSFORM_FEEDBACK_OVERFLOW_ARB and <index> is non-zero."
  ;
  for (uVar4 = 1;
      uVar4 < (this->super_TransformFeedbackOverflowQueryErrorBase).
              super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams; uVar4 = uVar4 + 1)
  {
    (**(code **)(lVar3 + 0xa00))(0x82ec,uVar4,0x8865,&value);
    TransformFeedbackOverflowQueryErrorBase::verifyError
              (&this->super_TransformFeedbackOverflowQueryErrorBase,0x501);
  }
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    (this->super_TransformFeedbackOverflowQueryErrorBase).m_case_name =
         "GetQueryIndexediv must generate INVALID_VALUE if <target> is TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and <index> is greater than or equal to MAX_VERTEX_STREAMS."
    ;
    uVar4 = (this->super_TransformFeedbackOverflowQueryErrorBase).
            super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams;
    for (uVar5 = uVar4; uVar5 < uVar4 + 4; uVar5 = uVar5 + 1) {
      (**(code **)(lVar3 + 0xa00))(0x82ed,uVar5,0x8865,&value);
      TransformFeedbackOverflowQueryErrorBase::verifyError
                (&this->super_TransformFeedbackOverflowQueryErrorBase,0x501);
      uVar4 = (this->super_TransformFeedbackOverflowQueryErrorBase).
              super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams;
    }
  }
  (this->super_TransformFeedbackOverflowQueryErrorBase).m_case_name =
       "BeginQueryIndexed must generate INVALID_VALUE if <target> is TRANSFORM_FEEDBACK_OVERFLOW_ARB and <index> is non-zero."
  ;
  for (uVar4 = 1;
      uVar4 < (this->super_TransformFeedbackOverflowQueryErrorBase).
              super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams; uVar4 = uVar4 + 1)
  {
    (**(code **)(lVar3 + 0x28))(0x82ec,uVar4,this->m_query);
    TransformFeedbackOverflowQueryErrorBase::verifyError
              (&this->super_TransformFeedbackOverflowQueryErrorBase,0x501);
  }
  bVar1 = TransformFeedbackOverflowQueryBaseTest::supportsTransformFeedback3
                    ((TransformFeedbackOverflowQueryBaseTest *)this);
  if (bVar1) {
    (this->super_TransformFeedbackOverflowQueryErrorBase).m_case_name =
         "BeginQueryIndexed must generate INVALID_VALUE if <target> is TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and <index> is greater than or equal to MAX_VERTEX_STREAMS."
    ;
    uVar4 = (this->super_TransformFeedbackOverflowQueryErrorBase).
            super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams;
    for (uVar5 = uVar4; uVar5 < uVar4 + 4; uVar5 = uVar5 + 1) {
      (**(code **)(lVar3 + 0x28))(0x82ed,uVar5,this->m_query);
      TransformFeedbackOverflowQueryErrorBase::verifyError
                (&this->super_TransformFeedbackOverflowQueryErrorBase,0x501);
      uVar4 = (this->super_TransformFeedbackOverflowQueryErrorBase).
              super_TransformFeedbackOverflowQueryBaseTest.m_max_vertex_streams;
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TransformFeedbackOverflowQueryErrorBase).
             super_TransformFeedbackOverflowQueryBaseTest.super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();
		GLint				  value;

		startTest("GetQueryIndexediv must generate INVALID_VALUE if <target> is "
				  "TRANSFORM_FEEDBACK_OVERFLOW_ARB and <index> is non-zero.");

		for (GLuint i = 1; i < getMaxVertexStreams(); ++i)
		{
			gl.getQueryIndexediv(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, i, GL_CURRENT_QUERY, &value);
			verifyError(GL_INVALID_VALUE);
		}

		if (supportsTransformFeedback3())
		{
			startTest("GetQueryIndexediv must generate INVALID_VALUE if <target> is "
					  "TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and <index> is greater "
					  "than or equal to MAX_VERTEX_STREAMS.");

			for (GLuint i = getMaxVertexStreams(); i < getMaxVertexStreams() + 4; ++i)
			{
				gl.getQueryIndexediv(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i, GL_CURRENT_QUERY, &value);
				verifyError(GL_INVALID_VALUE);
			}
		}

		startTest("BeginQueryIndexed must generate INVALID_VALUE if <target> is "
				  "TRANSFORM_FEEDBACK_OVERFLOW_ARB and <index> is non-zero.");

		for (GLuint i = 1; i < getMaxVertexStreams(); ++i)
		{
			gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_OVERFLOW_ARB, i, m_query);
			verifyError(GL_INVALID_VALUE);
		}

		if (supportsTransformFeedback3())
		{
			startTest("BeginQueryIndexed must generate INVALID_VALUE if <target> is "
					  "TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB and <index> is greater "
					  "than or equal to MAX_VERTEX_STREAMS.");

			for (GLuint i = getMaxVertexStreams(); i < getMaxVertexStreams() + 4; ++i)
			{
				gl.beginQueryIndexed(GL_TRANSFORM_FEEDBACK_STREAM_OVERFLOW_ARB, i, m_query);
				verifyError(GL_INVALID_VALUE);
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}